

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_oper.cpp
# Opt level: O3

void __thiscall FParser::OPor(FParser *this,svalue_t *result,int start,int n,int stop)

{
  int iVar1;
  uint uVar2;
  
  EvaluateExpression(this,result,start,n + -1);
  iVar1 = intvalue(result);
  uVar2 = 1;
  if (iVar1 == 0) {
    EvaluateExpression(this,result,n + 1,stop);
    iVar1 = intvalue(result);
    uVar2 = (uint)(iVar1 != 0);
  }
  result->type = 1;
  (result->value).i = uVar2;
  return;
}

Assistant:

void FParser::OPor(svalue_t &result, int start, int n, int stop)
{
	int exprtrue = false;
	
	// if first is true, do not evaluate the second
	
	EvaluateExpression(result, start, n-1);
	
	if(intvalue(result))
		exprtrue = true;
	else
    {
		EvaluateExpression(result, n+1, stop);
		exprtrue = !!intvalue(result);
    }
	
	result.type = svt_int;
	result.value.i = exprtrue;
}